

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_local.c
# Opt level: O2

int localConv(mpt_convertable *val,mpt_type_t type,void *ptr)

{
  int iVar1;
  mpt_local_output *lo;
  uint8_t *puVar2;
  
  if (type == 0x100) {
    if (ptr == (void *)0x0) {
      return 0x83;
    }
    puVar2 = (uint8_t *)val[5]._vptr;
  }
  else {
    if (type != 4) {
      if (type == 0x81) {
        if (ptr == (void *)0x0) {
          return 0x84;
        }
        puVar2 = (uint8_t *)(val + 3);
      }
      else {
        if (type != 0x83) {
          if (type != 0x84) {
            if (type != 0) {
              return -3;
            }
            iVar1 = 0x100;
            if (ptr == (void *)0x0) {
              return 0x100;
            }
            puVar2 = localConv::fmt;
            goto LAB_001056b8;
          }
          if (ptr == (void *)0x0) {
            return 0x83;
          }
          puVar2 = (uint8_t *)(val + 1);
          goto LAB_001056b3;
        }
        if (ptr == (void *)0x0) {
          return 0x84;
        }
        puVar2 = (uint8_t *)(val + 2);
      }
      iVar1 = 0x84;
      goto LAB_001056b8;
    }
    if (ptr == (void *)0x0) {
      return 0x83;
    }
    puVar2 = (uint8_t *)val[6]._vptr;
  }
LAB_001056b3:
  iVar1 = 0x83;
LAB_001056b8:
  *(uint8_t **)ptr = puVar2;
  return iVar1;
}

Assistant:

static int localConv(MPT_INTERFACE(convertable) *val, MPT_TYPE(type) type, void *ptr)
{
	MPT_STRUCT(local_output) *lo = (void *) val;
	
	if (!type) {
		static const uint8_t fmt[] = {
			MPT_ENUM(TypeObjectPtr),
			MPT_ENUM(TypeLoggerPtr),
			MPT_ENUM(TypeOutputPtr),
			MPT_ENUM(TypeFilePtr),
			0
		};
		if (ptr) {
			*((const uint8_t **) ptr) = fmt;
		}
		return MPT_ENUM(TypeMetaPtr);
	}
	if (type == MPT_ENUM(TypeMetaPtr)) {
		if (ptr) *((void **) ptr) = lo->pass;
		return MPT_ENUM(TypeOutputPtr);
	}
	if (type == MPT_ENUM(TypeObjectPtr)) {
		if (ptr) *((void **) ptr) = &lo->_obj;
		return MPT_ENUM(TypeOutputPtr);
	}
	if (type == MPT_ENUM(TypeOutputPtr)) {
		if (ptr) *((void **) ptr) = &lo->_out;
		return MPT_ENUM(TypeObjectPtr);
	}
	if (type == MPT_ENUM(TypeLoggerPtr)) {
		if (ptr) *((void **) ptr) = &lo->_log;
		return MPT_ENUM(TypeObjectPtr);
	}
	if (type == MPT_ENUM(TypeFilePtr)) {
		if (ptr) *((void **) ptr) = lo->hist.info.file;
		return MPT_ENUM(TypeOutputPtr);
	}
	return MPT_ERROR(BadType);
}